

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O3

xxh_u64 XXH64_finalize(xxh_u64 h64,xxh_u8 *ptr,size_t len,XXH_alignment align)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  for (uVar1 = (ulong)((uint)len & 0x1f); 7 < uVar1; uVar1 = uVar1 - 8) {
    uVar2 = (*(long *)ptr * -0x6c158a5880000000 |
            (ulong)(*(long *)ptr * -0x3d4d51c2d82b14b1) >> 0x21) * -0x61c8864e7a143579 ^ h64;
    ptr = (xxh_u8 *)((long)ptr + 8);
    h64 = (uVar2 << 0x1b | uVar2 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  }
  if (3 < uVar1) {
    uVar2 = (ulong)*(uint *)ptr * -0x61c8864e7a143579 ^ h64;
    ptr = (xxh_u8 *)((long)ptr + 4);
    h64 = (uVar2 << 0x17 | uVar2 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    uVar1 = uVar1 - 4;
  }
  if (uVar1 != 0) {
    uVar2 = 0;
    do {
      uVar3 = (ulong)*(byte *)((long)ptr + uVar2) * 0x27d4eb2f165667c5 ^ h64;
      h64 = (uVar3 << 0xb | uVar3 >> 0x35) * -0x61c8864e7a143579;
      uVar2 = uVar2 + 1;
    } while (uVar1 != uVar2);
  }
  uVar1 = (h64 >> 0x21 ^ h64) * -0x3d4d51c2d82b14b1;
  uVar1 = (uVar1 >> 0x1d ^ uVar1) * 0x165667b19e3779f9;
  return uVar1 >> 0x20 ^ uVar1;
}

Assistant:

static xxh_u64
XXH64_finalize(xxh_u64 h64, const xxh_u8* ptr, size_t len, XXH_alignment align)
{
    if (ptr==NULL) XXH_ASSERT(len == 0);
    len &= 31;
    while (len >= 8) {
        xxh_u64 const k1 = XXH64_round(0, XXH_get64bits(ptr));
        ptr += 8;
        h64 ^= k1;
        h64  = XXH_rotl64(h64,27) * XXH_PRIME64_1 + XXH_PRIME64_4;
        len -= 8;
    }
    if (len >= 4) {
        h64 ^= (xxh_u64)(XXH_get32bits(ptr)) * XXH_PRIME64_1;
        ptr += 4;
        h64 = XXH_rotl64(h64, 23) * XXH_PRIME64_2 + XXH_PRIME64_3;
        len -= 4;
    }
    while (len > 0) {
        h64 ^= (*ptr++) * XXH_PRIME64_5;
        h64 = XXH_rotl64(h64, 11) * XXH_PRIME64_1;
        --len;
    }
    return  XXH64_avalanche(h64);
}